

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O2

ostream * operator<<(ostream *os,parser *x)

{
  pointer pdVar1;
  pointer pbVar2;
  bool bVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *flag;
  pointer __lhs;
  definition *definition;
  pointer pdVar5;
  
  pdVar1 = (x->definitions).
           super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar5 = (x->definitions).
                super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar5 != pdVar1; pdVar5 = pdVar5 + 1) {
    std::operator<<(os,"    ");
    pbVar2 = (pdVar5->flags).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__lhs = (pdVar5->flags).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar2; __lhs = __lhs + 1) {
      std::operator<<(os,(string *)__lhs);
      bVar3 = std::operator!=(__lhs,(pdVar5->flags).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1);
      if (bVar3) {
        std::operator<<(os,anon_var_dwarf_131723 + 3);
      }
    }
    poVar4 = std::operator<<(os,"\n        ");
    poVar4 = std::operator<<(poVar4,(string *)&pdVar5->help);
    std::operator<<(poVar4,'\n');
  }
  return os;
}

Assistant:

inline
std::ostream& operator << (std::ostream& os, const argagg::parser& x)
{
  for (auto& definition : x.definitions) {
    os << "    ";
    for (auto& flag : definition.flags) {
      os << flag;
      if (flag != definition.flags.back()) {
        os << ", ";
      }
    }
    os << "\n        " << definition.help << '\n';
  }
  return os;
}